

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateConstructorBody
          (MessageGenerator *this,Printer *printer,vector<bool,_std::allocator<bool>_> *processed,
          bool copy_constructor)

{
  unsigned_long uVar1;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  const_reference ppFVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  pointer pvVar8;
  char *text;
  FieldGenerator *pFVar9;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  reference rVar10;
  undefined1 local_128 [8];
  string last_field_name;
  string first_field_name;
  size_t run_length;
  _Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_true>
  local_d8;
  _Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_true>
  local_d0;
  const_iterator it;
  FieldDescriptor *field_1;
  _Bit_type local_b8;
  int local_ac;
  string local_a8 [4];
  int i_1;
  string pod_template;
  FieldDescriptor *field;
  int i;
  allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_> local_6b;
  equal_to<const_google::protobuf::FieldDescriptor_*> local_6a;
  hash<const_google::protobuf::FieldDescriptor_*> local_69;
  undefined1 local_68 [8];
  RunMap runs;
  FieldDescriptor *last_start;
  bool copy_constructor_local;
  vector<bool,_std::allocator<bool>_> *processed_local;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  runs.
  super_unordered_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>::
  allocator(&local_6b);
  hash_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
  ::hash_map((hash_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
              *)local_68,0,&local_69,&local_6a,&local_6b);
  std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>::
  ~allocator(&local_6b);
  for (field._0_4_ = 0;
      sVar4 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size(&this->optimized_order_), (ulong)(long)(int)field < sVar4;
      field._0_4_ = (int)field + 1) {
    ppFVar5 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[](&this->optimized_order_,(long)(int)field);
    pod_template.field_2._8_8_ = *ppFVar5;
    if (((copy_constructor) &&
        (bVar2 = anon_unknown_0::IsPOD((FieldDescriptor *)pod_template.field_2._8_8_), bVar2)) ||
       ((!copy_constructor &&
        (bVar2 = anon_unknown_0::CanConstructByZeroing
                           ((FieldDescriptor *)pod_template.field_2._8_8_,&this->options_), bVar2)))
       ) {
      if (runs.
          super_unordered_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
          ._M_h._M_single_bucket == (__node_base_ptr)0x0) {
        runs.
        super_unordered_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
        ._M_h._M_single_bucket = (__node_base_ptr)pod_template.field_2._8_8_;
      }
      pmVar6 = std::
               unordered_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
               ::operator[]((unordered_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                             *)local_68,
                            (key_type *)
                            &runs.
                             super_unordered_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                             ._M_h._M_single_bucket);
      *pmVar6 = *pmVar6 + 1;
    }
    else {
      runs.
      super_unordered_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
      ._M_h._M_single_bucket = (__node_base_ptr)0x0;
    }
  }
  std::__cxx11::string::string(local_a8);
  if (copy_constructor) {
    std::__cxx11::string::operator=
              (local_a8,
               "::memcpy(&$first$_, &from.$first$_,\n  reinterpret_cast<char*>(&$last$_) -\n  reinterpret_cast<char*>(&$first$_) + sizeof($last$_));\n"
              );
  }
  else {
    std::__cxx11::string::operator=
              (local_a8,
               "::memset(&$first$_, 0, reinterpret_cast<char*>(&$last$_) -\n  reinterpret_cast<char*>(&$first$_) + sizeof($last$_));\n"
              );
  }
  for (local_ac = 0; uVar7 = (ulong)local_ac,
      sVar4 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size(&this->optimized_order_), uVar7 < sVar4; local_ac = local_ac + 1) {
    rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](processed,(long)local_ac);
    local_b8 = rVar10._M_mask;
    field_1 = (FieldDescriptor *)rVar10._M_p;
    bVar2 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&field_1);
    if (!bVar2) {
      ppFVar5 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[](&this->optimized_order_,(long)local_ac);
      it.
      super__Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_true>
      ._M_cur = (_Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_true>
                 )*ppFVar5;
      local_d8._M_cur =
           (__node_type *)
           std::
           unordered_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
           ::find((unordered_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                   *)local_68,(key_type *)&it);
      std::__detail::
      _Node_const_iterator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false,_true>
      ::_Node_const_iterator
                ((_Node_const_iterator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false,_true>
                  *)&local_d0,
                 (_Node_iterator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false,_true>
                  *)&local_d8);
      run_length = (size_t)std::
                           unordered_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                           ::end((unordered_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                                  *)local_68);
      bVar3 = std::__detail::operator!=
                        (&local_d0,
                         (_Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_true>
                          *)&run_length);
      bVar2 = false;
      if (bVar3) {
        pvVar8 = std::__detail::
                 _Node_const_iterator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false,_true>
                 ::operator->((_Node_const_iterator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false,_true>
                               *)&local_d0);
        bVar2 = 1 < pvVar8->second;
      }
      if (bVar2) {
        pvVar8 = std::__detail::
                 _Node_const_iterator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false,_true>
                 ::operator->((_Node_const_iterator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false,_true>
                               *)&local_d0);
        uVar1 = pvVar8->second;
        FieldName_abi_cxx11_
                  ((string *)((long)&last_field_name.field_2 + 8),
                   (cpp *)it.
                          super__Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_true>
                          ._M_cur,field_00);
        ppFVar5 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::operator[](&this->optimized_order_,(long)local_ac + -1 + uVar1);
        FieldName_abi_cxx11_((string *)local_128,(cpp *)*ppFVar5,field_01);
        text = (char *)std::__cxx11::string::c_str();
        io::Printer::Print(printer,text,"first",(string *)((long)&last_field_name.field_2 + 8),
                           "last",(string *)local_128);
        local_ac = local_ac + (int)uVar1 + -1;
        std::__cxx11::string::~string((string *)local_128);
        std::__cxx11::string::~string((string *)(last_field_name.field_2._M_local_buf + 8));
      }
      else if (copy_constructor) {
        pFVar9 = FieldGeneratorMap::get
                           (&this->field_generators_,
                            (FieldDescriptor *)
                            it.
                            super__Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_true>
                            ._M_cur);
        (*pFVar9->_vptr_FieldGenerator[0xc])(pFVar9,printer);
      }
      else {
        pFVar9 = FieldGeneratorMap::get
                           (&this->field_generators_,
                            (FieldDescriptor *)
                            it.
                            super__Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_true>
                            ._M_cur);
        (*pFVar9->_vptr_FieldGenerator[0xe])(pFVar9,printer);
      }
    }
  }
  std::__cxx11::string::~string(local_a8);
  hash_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
  ::~hash_map((hash_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
               *)local_68);
  return;
}

Assistant:

void MessageGenerator::GenerateConstructorBody(io::Printer* printer,
                                               std::vector<bool> processed,
                                               bool copy_constructor) const {
  const FieldDescriptor* last_start = NULL;
  // RunMap maps from fields that start each run to the number of fields in that
  // run.  This is optimized for the common case that there are very few runs in
  // a message and that most of the eligible fields appear together.
  typedef hash_map<const FieldDescriptor*, size_t> RunMap;
  RunMap runs;

  for (int i = 0; i < optimized_order_.size(); ++i) {
    const FieldDescriptor* field = optimized_order_[i];
    if ((copy_constructor && IsPOD(field)) ||
        (!copy_constructor && CanConstructByZeroing(field, options_))) {
      if (last_start == NULL) {
        last_start = field;
      }

      runs[last_start]++;
    } else {
      last_start = NULL;
    }
  }

  string pod_template;
  if (copy_constructor) {
    pod_template =
        "::memcpy(&$first$_, &from.$first$_,\n"
        "  reinterpret_cast<char*>(&$last$_) -\n"
        "  reinterpret_cast<char*>(&$first$_) + sizeof($last$_));\n";
  } else {
    pod_template =
        "::memset(&$first$_, 0, reinterpret_cast<char*>(&$last$_) -\n"
        "  reinterpret_cast<char*>(&$first$_) + sizeof($last$_));\n";
  }

  for (int i = 0; i < optimized_order_.size(); ++i) {
    if (processed[i]) {
      continue;
    }

    const FieldDescriptor* field = optimized_order_[i];
    RunMap::const_iterator it = runs.find(field);

    // We only apply the memset technique to runs of more than one field, as
    // assignment is better than memset for generated code clarity.
    if (it != runs.end() && it->second > 1) {
      // Use a memset, then skip run_length fields.
      const size_t run_length = it->second;
      const string first_field_name = FieldName(field);
      const string last_field_name =
          FieldName(optimized_order_[i + run_length - 1]);

      printer->Print(pod_template.c_str(),
        "first", first_field_name,
        "last", last_field_name);

      i += run_length - 1;
      // ++i at the top of the loop.
    } else {
      if (copy_constructor) {
        field_generators_.get(field).GenerateCopyConstructorCode(printer);
      } else {
        field_generators_.get(field).GenerateConstructorCode(printer);
      }
    }
  }
}